

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O1

void __thiscall
cfd::js::api::json::AddTapscriptSignRequest::~AddTapscriptSignRequest(AddTapscriptSignRequest *this)

{
  pointer pcVar1;
  
  (this->super_JsonClassBase<cfd::js::api::json::AddTapscriptSignRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__AddTapscriptSignRequest_00a8a588;
  AddTapscriptSignTxInRequest::~AddTapscriptSignTxInRequest(&this->txin_);
  pcVar1 = (this->tx_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->tx_).field_2) {
    operator_delete(pcVar1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->ignore_items)._M_t);
  return;
}

Assistant:

virtual ~AddTapscriptSignRequest() {
    // do nothing
  }